

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMeshControl::AddBoundaryInterfaceElements(TPZMHMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long lVar3;
  _Base_ptr p_Var4;
  int iVar5;
  int iVar6;
  TPZCompEl **ppTVar7;
  TPZGeoEl *pTVar8;
  _Base_ptr p_Var9;
  long lVar10;
  TPZInterfaceElement *this_00;
  _Rb_tree_header *p_Var11;
  int64_t iVar12;
  long nelem;
  TPZCompElSide cs;
  TPZGeoElSide gelside;
  set<int,_std::less<int>,_std::allocator<int>_> notincluded;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZGeoElSide gs;
  TPZCompElSide celside;
  TPZCompElSide local_170;
  TPZGeoElSide local_160;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_148;
  TPZStack<TPZCompElSide,_10> local_118;
  TPZGeoElSide local_58;
  TPZCompElSide local_40;
  
  TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
  iVar2 = ((this->fGMesh).fRef)->fPointer->fDim;
  p_Var1 = &local_148._M_impl.super__Rb_tree_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_148,
             &this->fSkeletonMatId);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_148,
             &this->fLagrangeMatIdLeft);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_148,
             &this->fLagrangeMatIdRight);
  lVar3 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  if (0 < lVar3) {
    nelem = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if ((((*ppTVar7 != (TPZCompEl *)0x0) &&
           (pTVar8 = TPZCompEl::Reference(*ppTVar7), pTVar8 != (TPZGeoEl *)0x0)) &&
          (iVar5 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8), iVar5 != iVar2)) &&
         (iVar5 = (**(code **)(*(long *)pTVar8 + 0x1d0))(pTVar8), iVar5 == 0)) {
        iVar5 = pTVar8->fMatId;
        p_Var9 = &p_Var1->_M_header;
        for (p_Var4 = local_148._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
            p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < iVar5]) {
          if (iVar5 <= (int)*(size_t *)(p_Var4 + 1)) {
            p_Var9 = p_Var4;
          }
        }
        p_Var11 = p_Var1;
        if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
           (p_Var11 = (_Rb_tree_header *)p_Var9,
           iVar5 < (int)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
          p_Var11 = p_Var1;
        }
        if (p_Var11 == p_Var1) {
          iVar6 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8);
          if (iVar6 != iVar2 + -1) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                       ,0x403);
          }
          lVar10 = 0x28;
          do {
            *(undefined8 *)
             ((long)local_118.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar10 + -0x28) = 0;
            *(undefined4 *)
             ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                      (local_118.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                     super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar10) = 0xffffffff;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 200);
          local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0
          ;
          local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
          local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01842198;
          local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
               local_118.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
          local_160.fSide = (**(code **)(*(long *)pTVar8 + 0xf0))(pTVar8);
          local_160.fSide = local_160.fSide + -1;
          local_160.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
          local_160.fGeoEl = pTVar8;
          TPZGeoElSide::Reference(&local_160);
          TPZGeoElSide::EqualorHigherCompElementList2(&local_160,&local_118,1,0);
          if (0 < local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  fNElements) {
            lVar10 = 8;
            iVar12 = local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                     fNElements;
            do {
              local_170.fEl =
                   *(TPZCompEl **)
                    ((long)local_118.super_TPZManVector<TPZCompElSide,_10>.
                           super_TPZVec<TPZCompElSide>.fStore + lVar10 + -8);
              local_170.fSide =
                   *(int *)((long)&(local_118.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar10);
              TPZCompElSide::Reference(&local_58,&local_170);
              if ((local_58.fGeoEl != local_160.fGeoEl) || (local_58.fSide != local_160.fSide)) {
                pTVar8 = (TPZGeoEl *)
                         (**(code **)(*(long *)local_58.fGeoEl + 0x170))
                                   (local_58.fGeoEl,local_58.fSide,iVar5);
                this_00 = (TPZInterfaceElement *)operator_new(0x80);
                TPZInterfaceElement::TPZInterfaceElement
                          (this_00,((this->fCMesh).fRef)->fPointer,pTVar8,&local_170,&local_40);
              }
              lVar10 = lVar10 + 0x10;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          if (local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore ==
              local_118.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
            local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
                 (TPZCompElSide *)0x0;
          }
          local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
          local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
               (_func_int **)&PTR__TPZVec_0183b970;
          if (local_118.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
              (TPZCompElSide *)0x0) {
            operator_delete__(local_118.super_TPZManVector<TPZCompElSide,_10>.
                              super_TPZVec<TPZCompElSide>.fStore);
          }
        }
      }
      nelem = nelem + 1;
    } while (nelem != lVar3);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_148);
  return;
}

Assistant:

void TPZMHMeshControl::AddBoundaryInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::set<int> notincluded;
    notincluded.insert(fSkeletonMatId);
    notincluded.insert(fLagrangeMatIdLeft);
    notincluded.insert(fLagrangeMatIdRight);
    int64_t nel = fCMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        if (!cel) {
            continue;
        }
        TPZGeoEl *gel = cel->Reference();
        if (!gel || gel->Dimension() == dim || gel->HasSubElement()) {
            continue;
        }
        int matid = gel->MaterialId();
        if (notincluded.find(matid) != notincluded.end()) {
            continue;
        }
        if (gel->Dimension() != dim-1) {
            DebugStop();
        }
        TPZStack<TPZCompElSide> celstack;
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celside = gelside.Reference();
        gelside.EqualorHigherCompElementList2(celstack, 1, 0);
        int64_t nst = celstack.size();
        for (int64_t i=0; i<nst; i++) {
            TPZCompElSide cs = celstack[i];
            TPZGeoElSide gs = cs.Reference();
            if (gs == gelside) {
                continue;
            }
            TPZGeoEl *gelnew = gs.Element()->CreateBCGeoEl(gs.Side(), matid);
            new TPZInterfaceElement(fCMesh, gelnew, cs, celside);

        }
    }
}